

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

size_t __thiscall docopt::BranchPattern::hash(BranchPattern *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  unsigned_long local_48;
  __shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_40;
  shared_ptr<docopt::Pattern> *child;
  const_iterator __end2;
  const_iterator __begin2;
  PatternList *__range2;
  size_t local_18;
  size_t seed;
  BranchPattern *this_local;
  
  seed = (size_t)this;
  if (this == (BranchPattern *)0x0) {
    __cxa_bad_typeid();
  }
  local_18 = std::type_info::hash_code((type_info *)(this->super_Pattern)._vptr_Pattern[-1]);
  __range2 = (PatternList *)
             std::
             vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ::size(&this->fChildren);
  hash_combine<unsigned_long>(&local_18,(unsigned_long *)&__range2);
  __end2 = std::
           vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ::begin(&this->fChildren);
  child = (shared_ptr<docopt::Pattern> *)
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::end(&this->fChildren);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                                *)&child);
    if (!bVar1) break;
    local_40 = (__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
               ::operator*(&__end2);
    peVar3 = std::__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_40);
    iVar2 = (*peVar3->_vptr_Pattern[5])();
    local_48 = CONCAT44(extraout_var,iVar2);
    hash_combine<unsigned_long>(&local_18,&local_48);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
    ::operator++(&__end2);
  }
  return local_18;
}

Assistant:

virtual size_t hash() const override {
			size_t seed = typeid(*this).hash_code();
			hash_combine(seed, fChildren.size());
			for(auto const& child : fChildren) {
				hash_combine(seed, child->hash());
			}
			return seed;
		}